

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

DWORD FlatStream_CheckFile(TBlockStream *pStream)

{
  uint uVar1;
  uint uVar2;
  uint local_30;
  DWORD i;
  BYTE ExpectedValue;
  DWORD ExtraBitsCount;
  DWORD WholeByteCount;
  LPBYTE FileBitmap;
  TBlockStream *pStream_local;
  
  uVar1 = pStream->BlockCount >> 3;
  uVar2 = pStream->BlockCount & 7;
  local_30 = 0;
  while( true ) {
    if (uVar1 <= local_30) {
      if ((uVar2 == 0) ||
         (*(char *)((long)pStream->FileBitmap + (ulong)uVar1) ==
          (char)((char)(1 << (sbyte)uVar2) + -1))) {
        pStream_local._4_4_ = 1;
      }
      else {
        pStream_local._4_4_ = 0;
      }
      return pStream_local._4_4_;
    }
    if (*(char *)((long)pStream->FileBitmap + (ulong)local_30) != -1) break;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

static DWORD FlatStream_CheckFile(TBlockStream * pStream)
{
    LPBYTE FileBitmap = (LPBYTE)pStream->FileBitmap;
    DWORD WholeByteCount = (pStream->BlockCount / 8);
    DWORD ExtraBitsCount = (pStream->BlockCount & 7);
    BYTE ExpectedValue;

    // Verify the whole bytes - their value must be 0xFF
    for(DWORD i = 0; i < WholeByteCount; i++)
    {
        if(FileBitmap[i] != 0xFF)
            return 0;
    }

    // If there are extra bits, calculate the mask
    if(ExtraBitsCount != 0)
    {
        ExpectedValue = (BYTE)((1 << ExtraBitsCount) - 1);
        if(FileBitmap[WholeByteCount] != ExpectedValue)
            return 0;
    }

    // Yes, the file is complete
    return 1;
}